

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
optimization::common_expr_del::BlockNodes::cast_operands_abi_cxx11_
          (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,BlockNodes *this,
          vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *value)

{
  pointer pVVar1;
  bool bVar2;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar3;
  mapped_type *pmVar4;
  uint32_t *puVar5;
  pointer val_00;
  VarId var;
  Value val;
  key_type local_b8;
  undefined1 local_a8 [16];
  uint32_t local_98;
  undefined1 local_90;
  undefined2 local_8f;
  VarId local_88;
  _Variadic_union<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_58;
  undefined1 local_50 [24];
  char local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (val_00 = (value->super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>).
                _M_impl.super__Vector_impl_data._M_start; val_00 != pVVar1; val_00 = val_00 + 1) {
    mir::inst::Value::Value((Value *)local_50,val_00);
    if (local_38 == '\0') {
      puVar5 = (uint32_t *)
               std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(local_50 + 8));
      local_78._M_first._M_storage = (_Uninitialized<int,_true>)*puVar5;
      local_58 = 0;
      std::
      vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
      ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                ((vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
                  *)__return_storage_ptr__,
                 (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78._M_first);
    }
    else {
      pvVar3 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)(local_50 + 8));
      local_b8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_b8.id = pvVar3->id;
      local_88.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_88.id = local_b8.id;
      bVar2 = query_var(this,&local_88);
      if (!bVar2) {
        local_a8._8_8_ = &PTR_display_001d90d0;
        local_98 = local_b8.id;
        local_90 = 1;
        local_a8._0_8_ = &PTR_display_001dafa8;
        local_8f._0_1_ = Lsl;
        local_8f._1_1_ = '\0';
        add_leaf_node(this,(Value *)local_a8);
      }
      pmVar4 = std::
               map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
               ::operator[](&this->var_map,&local_b8);
      local_78._M_first._M_storage = (_Uninitialized<int,_true>)pmVar4->id;
      local_58 = 1;
      std::
      vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
      ::emplace_back<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>
                ((vector<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>,std::allocator<std::variant<int,optimization::common_expr_del::NodeId,std::__cxx11::string>>>
                  *)__return_storage_ptr__,
                 (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78._M_first);
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_78._M_first);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Operand> cast_operands(std::vector<mir::inst::Value> value) {
    std::vector<Operand> operands;
    for (auto val : value) {
      if (val.index() == 0) {
        operands.push_back(std::get<int>(val));
      } else {
        auto var = std::get<mir::inst::VarId>(val);
        if (!query_var(var)) {
          add_leaf_node(var);
        }
        auto nodeId = var_map[var];
        operands.push_back(nodeId);
      }
    }
    return operands;
  }